

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

int lyv_data_unique(lyd_node *list)

{
  uint uVar1;
  lys_node *plVar2;
  int iVar3;
  uint32_t uVar4;
  ly_set *set;
  void *pvVar5;
  hash_table *phVar6;
  long *plVar7;
  lyd_node *plVar8;
  size_t len;
  int iVar9;
  ulong uVar10;
  ly_ctx *plVar11;
  ly_ctx *plVar12;
  lys_node *extraout_RDX;
  lys_node *plVar13;
  byte bVar14;
  undefined1 *puVar15;
  char *pcVar16;
  char *pcVar17;
  undefined1 *puVar18;
  bool bVar19;
  char *local_68;
  char *path;
  undefined1 *local_58;
  hash_table *local_50;
  char *id;
  ly_ctx *local_40;
  void *local_38;
  
  if ((list->validity & 2) == 0) {
    return 0;
  }
  plVar2 = list->schema;
  plVar11 = plVar2->module->ctx;
  iVar3 = ly_vlog_build_path(LY_VLOG_LYD,list,&local_68,0,1);
  if (iVar3 != 0) {
    return -1;
  }
  set = lyd_find_path(list,local_68);
  free(local_68);
  if (set == (ly_set *)0x0) {
    return -1;
  }
  uVar1 = set->number;
  plVar13 = extraout_RDX;
  if ((ulong)uVar1 != 0) {
    uVar10 = 0;
    do {
      plVar13 = (set->set).s[uVar10];
      *(byte *)&plVar13->dsc = *(byte *)&plVar13->dsc & 0xfd;
      uVar10 = uVar10 + 1;
    } while (uVar1 != uVar10);
  }
  if (uVar1 == 2) {
    iVar3 = lyv_list_uniq_equal((set->set).s,(set->set).s + 1,(int)plVar13,(void *)0x0);
    if (iVar3 != 0) {
      ly_set_free(set);
      return 1;
    }
LAB_0011fab9:
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if (uVar1 < 3) goto LAB_0011fab9;
    iVar9 = -1;
    do {
      if (uVar1 <= 0xffffffffU >> ((byte)iVar9 & 0x1f)) {
        id = (char *)CONCAT44(id._4_4_,1 << (-(byte)iVar9 & 0x1f));
        bVar14 = plVar2->padding[3];
        puVar15 = (undefined1 *)(ulong)bVar14;
        pvVar5 = malloc((ulong)((uint)bVar14 * 8));
        if (pvVar5 == (void *)0x0) {
          ly_log(plVar11,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyv_data_unique");
          goto LAB_0011fcd5;
        }
        path = (char *)plVar2;
        local_40 = plVar11;
        local_38 = pvVar5;
        if (bVar14 == 0) goto LAB_0011fb41;
        puVar18 = &DAT_00000001;
        goto LAB_0011fb05;
      }
      iVar9 = iVar9 + -1;
    } while (iVar9 != -0x20);
    ly_log(plVar11,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
           ,0x123);
LAB_0011fcd5:
    iVar3 = -1;
  }
  bVar14 = 0;
  pvVar5 = (void *)0x0;
LAB_0011fcde:
  ly_set_free(set);
  if (bVar14 != 0) {
    uVar10 = 0;
    do {
      phVar6 = *(hash_table **)((long)pvVar5 + uVar10 * 8);
      if (phVar6 == (hash_table *)0x0) break;
      lyht_free(phVar6);
      uVar10 = uVar10 + 1;
    } while (bVar14 != uVar10);
  }
  free(pvVar5);
  return iVar3;
  while (bVar19 = puVar18 != puVar15, puVar18 = puVar18 + 1, bVar19) {
LAB_0011fb05:
    phVar6 = lyht_new((uint32_t)id,8,lyv_list_uniq_equal,puVar18,0);
    *(hash_table **)((long)local_38 + (long)puVar18 * 8 + -8) = phVar6;
    if (phVar6 == (hash_table *)0x0) {
      ly_log(local_40,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyv_data_unique");
      iVar3 = -1;
      goto LAB_0011fd55;
    }
  }
LAB_0011fb41:
  if (set->number != 0) {
    plVar11 = (ly_ctx *)0x0;
    pcVar16 = path;
    local_58 = puVar15;
    do {
      plVar12 = plVar11;
      if ((char)puVar15 != '\0') {
        puVar18 = (undefined1 *)0x0;
        local_40 = plVar11;
        do {
          local_50 = (hash_table *)0x0;
          pcVar17 = (char *)((long)puVar18 * 0x10);
          if (pcVar17[*(long *)(pcVar16 + 0x90) + 8] == '\0') {
            uVar4 = 0;
          }
          else {
            plVar7 = (long *)(pcVar17 + *(long *)(pcVar16 + 0x90));
            uVar10 = 0;
            uVar4 = 0;
            id = pcVar17;
            do {
              plVar8 = resolve_data_descendant_schema_nodeid
                                 (*(char **)(*plVar7 + uVar10 * 8),
                                  (lyd_node *)(set->set).s[(long)plVar12]->parent);
              if (plVar8 == (lyd_node *)0x0) {
                iVar3 = lyd_get_unique_default
                                  (*(char **)(*(long *)(id + *(long *)(pcVar16 + 0x90)) + uVar10 * 8
                                             ),(lyd_node *)(set->set).s[(long)plVar12],
                                   (char **)&local_50);
                if (iVar3 != 0) {
                  iVar3 = -1;
                  puVar15 = local_58;
                  goto LAB_0011fd55;
                }
              }
              else {
                local_50 = plVar8->ht;
              }
              phVar6 = local_50;
              plVar12 = local_40;
              pcVar16 = path;
              if (local_50 == (hash_table *)0x0) break;
              len = strlen((char *)local_50);
              uVar4 = dict_hash_multi(uVar4,(char *)phVar6,len);
              uVar10 = uVar10 + 1;
              plVar7 = (long *)(id + *(long *)(path + 0x90));
              plVar12 = local_40;
              pcVar16 = path;
            } while (uVar10 < (byte)id[*(long *)(path + 0x90) + 8]);
          }
          if (local_50 != (hash_table *)0x0) {
            uVar4 = dict_hash_multi(uVar4,(char *)0x0,0);
            iVar3 = lyht_insert(*(hash_table **)((long)local_38 + (long)puVar18 * 8),
                                (set->set).s + (long)plVar11,uVar4,(void **)0x0);
            plVar12 = local_40;
            if (iVar3 != 0) {
              iVar3 = 1;
              puVar15 = local_58;
              goto LAB_0011fd55;
            }
          }
          puVar18 = puVar18 + 1;
          puVar15 = local_58;
        } while (puVar18 != local_58);
      }
      plVar11 = (ly_ctx *)((long)&(plVar12->dict).hash_tab + 1);
      iVar3 = 0;
    } while (plVar11 < (ly_ctx *)(ulong)set->number);
  }
LAB_0011fd55:
  bVar14 = (byte)puVar15;
  pvVar5 = local_38;
  goto LAB_0011fcde;
}

Assistant:

int
lyv_data_unique(struct lyd_node *list)
{
    struct lyd_node *diter;
    struct ly_set *set;
    uint32_t i, j, n = 0;
    int ret = 0;
    uint32_t hash, u, usize = 0;
    struct hash_table **uniqtables = NULL;
    const char *id;
    char *path;
    struct lys_node_list *slist;
    struct ly_ctx *ctx = list->schema->module->ctx;

    if (!(list->validity & LYD_VAL_UNIQUE)) {
        /* validated sa part of another instance validation */
        return 0;
    }

    slist = (struct lys_node_list *)list->schema;

    /* get all list instances */
    if (ly_vlog_build_path(LY_VLOG_LYD, list, &path, 0, 1)) {
        return -1;
    }
    set = lyd_find_path(list, path);
    free(path);
    if (!set) {
        return -1;
    }

    for (i = 0; i < set->number; ++i) {
        /* remove the flag */
        set->set.d[i]->validity &= ~LYD_VAL_UNIQUE;
    }

    if (set->number == 2) {
        /* simple comparison */
        if (lyv_list_uniq_equal(&set->set.d[0], &set->set.d[1], 0, (void *)0)) {
            /* instance duplication */
            ly_set_free(set);
            return 1;
        }
    } else if (set->number > 2) {
        /* use hashes for comparison */
        /* first, allocate the table, the size depends on number of items in the set */
        for (u = 31; u > 0; u--) {
            usize = set->number << u;
            usize = usize >> u;
            if (usize == set->number) {
                break;
            }
        }
        if (u == 0) {
            LOGINT(ctx);
            ret = -1;
            goto cleanup;
        } else {
            u = 32 - u;
            usize = 1 << u;
        }

        n = slist->unique_size;
        uniqtables = malloc(n * sizeof *uniqtables);
        if (!uniqtables) {
            LOGMEM(ctx);
            ret = -1;
            n = 0;
            goto cleanup;
        }
        for (j = 0; j < n; j++) {
            uniqtables[j] = lyht_new(usize, sizeof(struct lyd_node *), lyv_list_uniq_equal, (void *)(j + 1L), 0);
            if (!uniqtables[j]) {
                LOGMEM(ctx);
                ret = -1;
                goto cleanup;
            }
        }

        for (u = 0; u < set->number; u++) {
            /* loop for unique - get the hash for the instances */
            for (j = 0; j < n; j++) {
                id = NULL;
                for (i = hash = 0; i < slist->unique[j].expr_size; i++) {
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[j].expr[i], set->set.d[u]->child);
                    if (diter) {
                        id = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        if (lyd_get_unique_default(slist->unique[j].expr[i], set->set.d[u], &id)) {
                            ret = -1;
                            goto cleanup;
                        }
                    }
                    if (!id) {
                        /* unique item not present nor has default value */
                        break;
                    }
                    hash = dict_hash_multi(hash, id, strlen(id));
                }
                if (!id) {
                    /* skip this list instance since its unique set is incomplete */
                    continue;
                }

                /* finish the hash value */
                hash = dict_hash_multi(hash, NULL, 0);

                /* insert into the hashtable */
                if (lyht_insert(uniqtables[j], &set->set.d[u], hash, NULL)) {
                    ret = 1;
                    goto cleanup;
                }
            }
        }
    }

cleanup:
    ly_set_free(set);
    for (j = 0; j < n; j++) {
        if (!uniqtables[j]) {
            /* failed when allocating uniquetables[j], following j are not allocated */
            break;
        }
        lyht_free(uniqtables[j]);
    }
    free(uniqtables);

    return ret;
}